

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O2

void __thiscall Am_Value_List::Delete(Am_Value_List *this,bool unique)

{
  undefined1 *puVar1;
  Am_List_Item *pAVar2;
  Am_List_Item **ppAVar3;
  Am_List_Item *this_00;
  Am_List_Item *pAVar4;
  
  this_00 = this->item;
  if ((this_00 != (Am_List_Item *)0x0) && (this->data != (Am_Value_List_Data *)0x0)) {
    if (unique) {
      Am_Value_List_Data::Make_Unique(this->data,&this->data,&this->item);
      this_00 = this->item;
    }
    pAVar4 = this_00->prev;
    pAVar2 = this_00->next;
    ppAVar3 = &pAVar4->next;
    if (pAVar4 == (Am_List_Item *)0x0) {
      ppAVar3 = &this->data->head;
    }
    *ppAVar3 = pAVar2;
    if (pAVar2 == (Am_List_Item *)0x0) {
      this->data->tail = pAVar4;
    }
    else {
      pAVar2->prev = pAVar4;
      pAVar4 = this_00->prev;
    }
    Am_Value::~Am_Value(&this_00->super_Am_Value);
    operator_delete(this_00);
    this->item = pAVar4;
    puVar1 = &(this->data->super_Am_Wrapper).field_0xc;
    *(short *)puVar1 = *(short *)puVar1 + -1;
    return;
  }
  Am_Error("** Am_Value_List::Delete: no item is current\n");
}

Assistant:

void
Am_Value_List::Delete(bool unique)
{
  if (item && data) {
    if (unique)
      data->Make_Unique(data, item);
    if (item->prev)
      item->prev->next = item->next;
    else
      data->head = item->next;
    if (item->next)
      item->next->prev = item->prev;
    else
      data->tail = item->prev;
    Am_List_Item *new_item;
    new_item = item->prev;
    delete item;
    item = new_item;
    --data->number;
  } else
    Am_Error("** Am_Value_List::Delete: no item is current\n");
}